

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

bool gog::anon_unknown_0::process_file_unar(string *file,extract_options *o,string *password)

{
  int iVar1;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  ulong uVar3;
  runtime_error *this;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  int ret;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string dir;
  value_type *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffe90;
  extract_options *in_stack_fffffffffffffeb8;
  string local_f8 [32];
  undefined4 local_d8;
  int local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined8 local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_60;
  string local_40 [40];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  ppVar2 = std::__niter_base<std::pair<bool,std::__cxx11::string>*>
                     (&in_RSI[5].second._M_string_length,in_RSI);
  std::__cxx11::string::string(local_40,(string *)ppVar2);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1425e0);
  if (((byte)(local_18->second)._M_dataplus & 1) == 0) {
    local_a0 = "lsar";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    if ((local_18->field_0x7 & 1) != 0) {
      local_a8 = "-t";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
    }
  }
  else {
    local_60 = "unar";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    local_78 = "-f";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    local_80 = "-D";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_88 = "-o";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
      local_90 = std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
    }
    if ((local_18->field_0x6 & 1) == 0) {
      local_98 = "-q";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_b0 = "-p";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    local_b8 = std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
  }
  local_c0 = "--";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  local_c8 = std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  local_d0 = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::front
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  iVar1 = util::run((char **)in_stack_fffffffffffffe88);
  local_d4 = iVar1;
  if ((iVar1 < 0) && ((anonymous_namespace)::quit_requested == 0)) {
    local_1 = 0;
  }
  else {
    if (0 < iVar1) {
      uVar4 = CONCAT13(1,(int3)in_stack_fffffffffffffe84);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      (anonymous_namespace)::get_verb_abi_cxx11_(in_stack_fffffffffffffeb8);
      std::operator+((char *)in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar4,iVar1));
      std::operator+(in_stack_fffffffffffffe88,(char *)CONCAT44(uVar4,iVar1));
      std::operator+(in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar4,iVar1));
      std::operator+(in_stack_fffffffffffffe88,(char *)CONCAT44(uVar4,iVar1));
      std::runtime_error::runtime_error(this,local_f8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = 1;
  }
  local_d8 = 1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool process_file_unar(const std::string & file, const extract_options & o, const std::string & password) {
	
	std::string dir = o.output_dir.string();
	
	std::vector<const char *> args;
	if(o.extract) {
		args.push_back("unar");
		
		args.push_back("-f"); // Overwrite existing files
		
		args.push_back("-D"); // Don't create directory
		
		if(!dir.empty()) {
			args.push_back("-o");
			args.push_back(dir.c_str());
		}
		
		if(!o.list) {
			args.push_back("-q"); // Disable file list
		}
		
	} else {
		args.push_back("lsar");
		
		if(o.test) {
			args.push_back("-t");
		}
	}
	
	if(!password.empty()) {
		args.push_back("-p");
		args.push_back(password.c_str());
	}
	
	args.push_back("--");
	
	args.push_back(file.c_str());
	
	args.push_back(NULL);
	
	int ret = util::run(&args.front());
	if(ret < 0 && !quit_requested) {
		return false;
	}
	
	if(ret > 0) {
		throw std::runtime_error("Could not " + get_verb(o) + " \"" + file + "\": unar failed");
	}
	
	return true;
}